

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O1

void __thiscall catalog::LoadIM_RM(catalog *this,IndexManager *IM,RecordManager *RM)

{
  TableInfo *pTVar1;
  _Base_ptr p_Var2;
  pointer ppTVar3;
  long lVar4;
  _Self __tmp;
  ulong uVar5;
  vector<IndexInfo,_std::allocator<IndexInfo>_> IndexList;
  vector<TableInfo,_std::allocator<TableInfo>_> TS;
  vector<IndexInfo,_std::allocator<IndexInfo>_> local_108;
  RecordManager *local_e8;
  IndexManager *local_e0;
  catalog *local_d8;
  long local_d0;
  undefined1 local_c8 [8];
  _Alloc_hider _Stack_c0;
  pointer local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  vector<TableInfo,_std::allocator<TableInfo>_> local_60;
  vector<IndexInfo,_std::allocator<IndexInfo>_> local_48;
  
  local_108.super__Vector_base<IndexInfo,_std::allocator<IndexInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<IndexInfo,_std::allocator<IndexInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<IndexInfo,_std::allocator<IndexInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = RM;
  local_e0 = IM;
  if (0 < this->tableNumber) {
    lVar4 = 0;
    local_d8 = this;
    do {
      pTVar1 = (local_d8->TableInfoList).
               super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4];
      p_Var2 = *(_Base_ptr *)((long)&(pTVar1->indexInfo)._M_t._M_impl + 0x18);
      local_d0 = lVar4;
      while (p_Var2 != (_Rb_tree_node_base *)((long)&(pTVar1->indexInfo)._M_t._M_impl + 8U)) {
        _Stack_c0._M_p = (pointer)&local_b0;
        local_b8 = (pointer)0x0;
        local_b0._M_local_buf[0] = '\0';
        local_a0._M_p = (pointer)&local_90;
        local_98 = 0;
        local_90._M_local_buf[0] = '\0';
        local_80._M_p = (pointer)&local_70;
        local_78 = 0;
        local_70._M_local_buf[0] = '\0';
        std::__cxx11::string::_M_assign((string *)&local_a0);
        std::__cxx11::string::_M_assign((string *)&_Stack_c0);
        local_c8._4_4_ =
             *(int *)(*(long *)&(pTVar1->type).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data + (long)(int)p_Var2[1]._M_color * 4);
        std::vector<IndexInfo,_std::allocator<IndexInfo>_>::push_back
                  (&local_108,(IndexInfo *)local_c8);
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        IndexInfo::~IndexInfo((IndexInfo *)local_c8);
      }
      lVar4 = local_d0 + 1;
      this = local_d8;
    } while (lVar4 < local_d8->tableNumber);
  }
  std::vector<IndexInfo,_std::allocator<IndexInfo>_>::vector(&local_48,&local_108);
  IndexManager::LoadAllBpTree(local_e0,&local_48);
  std::vector<IndexInfo,_std::allocator<IndexInfo>_>::~vector(&local_48);
  local_c8 = (undefined1  [8])0x0;
  _Stack_c0._M_p = (pointer)0x0;
  local_b8 = (pointer)0x0;
  ppTVar3 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar3) {
    uVar5 = 0;
    do {
      std::vector<TableInfo,_std::allocator<TableInfo>_>::push_back
                ((vector<TableInfo,_std::allocator<TableInfo>_> *)local_c8,ppTVar3[uVar5]);
      uVar5 = uVar5 + 1;
      ppTVar3 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->TableInfoList).
                                   super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3));
  }
  std::vector<TableInfo,_std::allocator<TableInfo>_>::vector
            (&local_60,(vector<TableInfo,_std::allocator<TableInfo>_> *)local_c8);
  RecordManager::LoadAllRecordSet(local_e8,&local_60);
  std::vector<TableInfo,_std::allocator<TableInfo>_>::~vector(&local_60);
  std::vector<TableInfo,_std::allocator<TableInfo>_>::~vector
            ((vector<TableInfo,_std::allocator<TableInfo>_> *)local_c8);
  std::vector<IndexInfo,_std::allocator<IndexInfo>_>::~vector(&local_108);
  return;
}

Assistant:

void catalog::LoadIM_RM(IndexManager& IM,RecordManager& RM){
    //load bptree record
    std::vector<IndexInfo> IndexList;
    for(int i = 0 ; i < tableNumber ; i ++){
        TableInfo* T = TableInfoList[i];
        auto it = T->indexInfo.begin();
        while(it!=T->indexInfo.end()){
            IndexInfo i;
            i.tableName = T->tableName;
            i.indexName = it->second;
            i.type = T->type[it->first];
            IndexList.push_back(i);
            it++;
        }
    }
    IM.LoadAllBpTree(IndexList);
    std::vector<TableInfo> TS;
    for(int i = 0 ; i < TableInfoList.size();i++){
        TS.push_back(*(TableInfoList[i]));
    }
    RM.LoadAllRecordSet(TS);
}